

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# case.c
# Opt level: O2

void ucase(char *cp)

{
  char cVar1;
  char cVar2;
  
  if (cp != (char *)0x0) {
    for (; cVar1 = *cp, cVar1 != '\0'; cp = cp + 1) {
      cVar2 = cVar1 + -0x20;
      if (0x19 < (byte)(cVar1 + 0x9fU)) {
        cVar2 = cVar1;
      }
      *cp = cVar2;
    }
  }
  return;
}

Assistant:

void
ucase(register char *cp)
{
    if (cp) {
        while (*cp) {
            *cp = UPPER_CASE(*cp);
            cp++;
        }
    }
}